

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

curl_hash_element * Curl_hash_next_element(curl_hash_iterator *iter)

{
  int iVar1;
  int iVar2;
  curl_llist *pcVar3;
  long lVar4;
  
  if (iter->current_element != (curl_llist_element *)0x0) {
    iter->current_element = iter->current_element->next;
  }
  if (iter->current_element == (curl_llist_element *)0x0) {
    iVar1 = iter->slot_index;
    iVar2 = iter->hash->slots;
    if (iVar1 < iVar2) {
      pcVar3 = iter->hash->table + iVar1;
      lVar4 = 0;
      do {
        if (pcVar3->head != (curl_llist_element *)0x0) {
          iter->current_element = pcVar3->head;
          iter->slot_index = (iVar1 - (int)lVar4) + 1;
          break;
        }
        lVar4 = lVar4 + -1;
        pcVar3 = pcVar3 + 1;
      } while ((long)iVar1 - (long)iVar2 != lVar4);
    }
  }
  if (iter->current_element == (curl_llist_element *)0x0) {
    iter->current_element = (curl_llist_element *)0x0;
    return (curl_hash_element *)0x0;
  }
  return (curl_hash_element *)iter->current_element->ptr;
}

Assistant:

struct curl_hash_element *
Curl_hash_next_element(struct curl_hash_iterator *iter)
{
  struct curl_hash *h = iter->hash;

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    int i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(h->table[i].head) {
        iter->current_element = h->table[i].head;
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  iter->current_element = NULL;
  return NULL;
}